

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O2

TermList ApplicativeHelper::getNthArg(TermList arrowSort,uint argNum)

{
  TermList TVar1;
  ulong uVar2;
  bool bVar3;
  
  TVar1._content = 2;
  while (bVar3 = argNum != 0, argNum = argNum - 1, bVar3) {
    uVar2 = (ulong)(*(uint *)(arrowSort._content + 0xc) & 0xfffffff);
    TVar1._content = *(uint64_t *)(arrowSort._content + 0x28 + uVar2 * 8);
    arrowSort._content = *(uint64_t *)(arrowSort._content + 0x20 + uVar2 * 8);
  }
  return (TermList)TVar1._content;
}

Assistant:

TermList ApplicativeHelper::getNthArg(TermList arrowSort, unsigned argNum)
{
  ASS(argNum > 0);

  TermList res;
  while(argNum >=1){
    ASS(arrowSort.isArrowSort());
    res = *arrowSort.term()->nthArgument(0);
    arrowSort = *arrowSort.term()->nthArgument(1);
    argNum--;
  }
  return res;
}